

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkImplementation * __thiscall
cmGeneratorTarget::GetLinkImplementation(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *this_00;
  cmGeneratorTarget *local_60 [3];
  cmGeneratorTarget *local_48;
  cmOptionalLinkImplementation *impl;
  string CONFIG;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  CONFIG.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmGeneratorTarget *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&impl,(string *)CONFIG.field_2._8_8_);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap>_>_>
               ::operator[](&this->LinkImplMap,(string *)&impl)->
               super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
    ;
    local_60[0] = this;
    local_48 = (cmGeneratorTarget *)
               std::
               map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
               ::operator[](this_00,local_60);
    if (((local_48->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color & _S_black
        ) == _S_red) {
      *(undefined1 *)
       &(local_48->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_black;
      ComputeLinkImplementationLibraries
                (this,(string *)CONFIG.field_2._8_8_,(cmOptionalLinkImplementation *)local_48,this);
    }
    if (((local_48->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0x100)
        == _S_red) {
      *(byte *)((long)&(local_48->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_color + 1) = 1;
      ComputeLinkImplementationLanguages
                (this,(string *)CONFIG.field_2._8_8_,(cmOptionalLinkImplementation *)local_48);
    }
    this_local = local_48;
    std::__cxx11::string::~string((string *)&impl);
  }
  return (cmLinkImplementation *)this_local;
}

Assistant:

const cmLinkImplementation* cmGeneratorTarget::GetLinkImplementation(
  const std::string& config) const
{
  // There is no link implementation for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmOptionalLinkImplementation& impl = this->LinkImplMap[CONFIG][this];
  if (!impl.LibrariesDone) {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, this);
  }
  if (!impl.LanguagesDone) {
    impl.LanguagesDone = true;
    this->ComputeLinkImplementationLanguages(config, impl);
  }
  return &impl;
}